

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioVoice_SetChannelVolumes
                   (FAudioVoice *voice,uint32_t Channels,float *pVolumes,uint32_t OperationSet)

{
  uint32_t in_ECX;
  float *in_RDX;
  uint32_t in_ESI;
  FAudioVoice *in_RDI;
  uint32_t i;
  uint local_28;
  uint32_t local_4;
  
  if ((in_ECX == 0) || (in_RDI->audio->active == '\0')) {
    if (in_RDX == (float *)0x0) {
      local_4 = 0x88960001;
    }
    else if (in_RDI->type == FAUDIO_VOICE_MASTER) {
      local_4 = 0x88960001;
    }
    else if ((in_RDI->audio->version < 8) || (in_ESI == in_RDI->outputChannels)) {
      FAudio_PlatformLockMutex((FAudioMutex)0x12834e);
      FAudio_PlatformLockMutex((FAudioMutex)0x12835f);
      SDL_memcpy(in_RDI->channelVolume,in_RDX,(ulong)in_ESI << 2);
      for (local_28 = 0; local_28 < (in_RDI->sends).SendCount; local_28 = local_28 + 1) {
        FAudio_RecalcMixMatrix(in_RDI,local_28);
      }
      FAudio_PlatformUnlockMutex((FAudioMutex)0x1283bc);
      FAudio_PlatformUnlockMutex((FAudioMutex)0x1283cd);
      local_4 = 0;
    }
    else {
      local_4 = 0x88960001;
    }
  }
  else {
    FAudio_OPERATIONSET_QueueSetChannelVolumes(in_RDI,in_ESI,in_RDX,in_ECX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FAudioVoice_SetChannelVolumes(
	FAudioVoice *voice,
	uint32_t Channels,
	const float *pVolumes,
	uint32_t OperationSet
) {
	uint32_t i;

	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueSetChannelVolumes(
			voice,
			Channels,
			pVolumes,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	if (pVolumes == NULL)
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	if (voice->audio->version > 7 && Channels != voice->outputChannels)
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	FAudio_PlatformLockMutex(voice->volumeLock);
	LOG_MUTEX_LOCK(voice->audio, voice->volumeLock)

	FAudio_memcpy(
		voice->channelVolume,
		pVolumes,
		sizeof(float) * Channels
	);

	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		FAudio_RecalcMixMatrix(voice, i);
	}

	FAudio_PlatformUnlockMutex(voice->volumeLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->volumeLock)

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)

	LOG_API_EXIT(voice->audio)
	return 0;
}